

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::MultiAggregationPS::execute
          (MultiAggregationPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  VarStatus VVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  VarStatus *pVVar5;
  char *pcVar6;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar7;
  VectorBase<double> *this_00;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  int k_1;
  double dualVal;
  double z;
  double scale;
  int k;
  double aij;
  double val;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  VectorBase<double> *in_stack_ffffffffffffff10;
  SVectorBase<double> *in_stack_ffffffffffffff18;
  Real in_stack_ffffffffffffff20;
  double dVar8;
  uint local_6c;
  double local_68;
  double local_60;
  double local_58;
  uint local_4c;
  double local_40;
  
  if (*(int *)((long)in_RDI + 0x2c) != *(int *)((long)in_RDI + 0x34)) {
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    dVar7 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    *pdVar4 = dVar7;
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    dVar7 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    *pdVar4 = dVar7;
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    VVar1 = *pVVar5;
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x34));
    *pVVar5 = VVar1;
  }
  if ((int)in_RDI[5] != (int)in_RDI[6]) {
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    dVar7 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    *pdVar4 = dVar7;
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    dVar7 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    *pdVar4 = dVar7;
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
    VVar1 = *pVVar5;
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6]);
    *pVVar5 = VVar1;
  }
  local_40 = 0.0;
  dVar7 = SVectorBase<double>::operator[]
                    (in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  for (local_4c = 0; iVar3 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0xd)),
      (int)local_4c < iVar3; local_4c = local_4c + 1) {
    pcVar6 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0xd),(char *)(ulong)local_4c,__c);
    if ((int)pcVar6 != (int)in_RDI[5]) {
      pdVar4 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0xd),local_4c);
      dVar8 = *pdVar4;
      SVectorBase<double>::index
                ((SVectorBase<double> *)(in_RDI + 0xd),(char *)(ulong)local_4c,__c_00);
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      local_40 = dVar8 * *pdVar4 + local_40;
    }
  }
  local_58 = maxAbs(in_stack_ffffffffffffff20,(Real)in_stack_ffffffffffffff18);
  if (local_58 < 1.0) {
    local_58 = 1.0;
  }
  local_60 = (double)in_RDI[10] / local_58 - local_40 / local_58;
  (**(code **)(*in_RDI + 0x38))();
  bVar2 = isZero<double,double>
                    ((double)in_stack_ffffffffffffff10,
                     (double)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (bVar2) {
    local_60 = 0.0;
  }
  pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  *pdVar4 = (local_60 * local_58) / dVar7;
  pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  *pdVar4 = 0.0;
  local_68 = 0.0;
  for (local_6c = 0; iVar3 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0x11)),
      (int)local_6c < iVar3; local_6c = local_6c + 1) {
    pcVar6 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0x11),(char *)(ulong)local_6c,__c_01);
    if ((int)pcVar6 != *(int *)((long)in_RDI + 0x2c)) {
      pdVar4 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0x11),local_6c);
      dVar8 = *pdVar4;
      SVectorBase<double>::index
                ((SVectorBase<double> *)(in_RDI + 0x11),(char *)(ulong)local_6c,__c_02);
      pdVar4 = VectorBase<double>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      local_68 = dVar8 * *pdVar4 + local_68;
    }
  }
  this_00 = (VectorBase<double> *)(((double)in_RDI[9] - local_68) / dVar7);
  pdVar4 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff0c);
  *pdVar4 = (double)this_00;
  pdVar4 = VectorBase<double>::operator[](this_00,in_stack_ffffffffffffff0c);
  *pdVar4 = 0.0;
  pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
  *pVVar5 = BASIC;
  if ((*(byte *)((long)in_RDI + 0x59) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0xb) & 1) == 0) {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
      *pVVar5 = ON_UPPER;
    }
    else {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
      *pVVar5 = ON_LOWER;
    }
  }
  else {
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    *pVVar5 = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::MultiAggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_const, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_const / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = 0.0;

#ifndef NDEBUG

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
      SPX_MSG_ERROR(std::cerr << "numerical violation in original space due to MultiAggregation\n";)
#endif

      // dual:
      R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}